

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

UConverter * ucnv_openCCSID_63(int32_t codepage,UConverterPlatform platform,UErrorCode *err)

{
  UBool UVar1;
  int32_t iVar2;
  UConverter *pUVar3;
  char local_68 [4];
  int32_t myNameLen;
  char myName [60];
  UErrorCode *err_local;
  UConverterPlatform platform_local;
  int32_t codepage_local;
  
  if ((err != (UErrorCode *)0x0) && (UVar1 = U_FAILURE(*err), UVar1 == '\0')) {
    iVar2 = ucnv_copyPlatformString(local_68,platform);
    T_CString_integerToString_63(local_68 + iVar2,codepage,10);
    pUVar3 = ucnv_createConverter_63((UConverter *)0x0,local_68,err);
    return pUVar3;
  }
  return (UConverter *)0x0;
}

Assistant:

U_CAPI UConverter*   U_EXPORT2
ucnv_openCCSID (int32_t codepage,
                UConverterPlatform platform,
                UErrorCode * err)
{
    char myName[UCNV_MAX_CONVERTER_NAME_LENGTH];
    int32_t myNameLen;

    if (err == NULL || U_FAILURE (*err))
        return NULL;

    /* ucnv_copyPlatformString could return "ibm-" or "cp" */
    myNameLen = ucnv_copyPlatformString(myName, platform);
    T_CString_integerToString(myName + myNameLen, codepage, 10);

    return ucnv_createConverter(NULL, myName, err);
}